

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point2f pbrt::RejectionSampleDisk(RNG *rng)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar8._8_4_ = 0x3f7fffff;
  auVar8._0_8_ = 0x3f7fffff3f7fffff;
  auVar8._12_4_ = 0x3f7fffff;
  auVar9._8_4_ = 0xc0000000;
  auVar9._0_8_ = 0xc0000000c0000000;
  auVar9._12_4_ = 0xc0000000;
  auVar1 = vpmovsxbq_avx(ZEXT216(0x2d1b));
  auVar2 = vpmovsxbq_avx(ZEXT216(0x1b2d));
  auVar10._8_4_ = 0x3f800000;
  auVar10._0_8_ = 0x3f8000003f800000;
  auVar10._12_4_ = 0x3f800000;
  uVar3 = rng->state;
  do {
    uVar4 = uVar3 * 0x5851f42d4c957f2d + rng->inc;
    uVar5 = uVar4 * 0x5851f42d4c957f2d + rng->inc;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar4;
    auVar7 = vpunpcklqdq_avx(auVar6,auVar11);
    auVar6 = vpsrlvq_avx2(auVar7,auVar1);
    auVar11 = vpsrlvq_avx2(auVar7,auVar2);
    auVar6 = vpshufd_avx(auVar6 ^ auVar11,0xe8);
    auVar7 = vpsrlq_avx(auVar7,0x3b);
    auVar7 = vpshufd_avx(auVar7,0xe8);
    auVar6 = vprorvd_avx512vl(auVar6,auVar7);
    auVar6 = vcvtudq2ps_avx512vl(auVar6);
    auVar7._0_4_ = auVar6._0_4_ * 2.3283064e-10;
    auVar7._4_4_ = auVar6._4_4_ * 2.3283064e-10;
    auVar7._8_4_ = auVar6._8_4_ * 2.3283064e-10;
    auVar7._12_4_ = auVar6._12_4_ * 2.3283064e-10;
    auVar6 = vminps_avx(auVar7,auVar8);
    auVar7 = vfmadd213ps_fma(auVar6,auVar9,auVar10);
    auVar12._0_4_ = auVar7._0_4_ * auVar7._0_4_;
    auVar12._4_4_ = auVar7._4_4_ * auVar7._4_4_;
    auVar12._8_4_ = auVar7._8_4_ * auVar7._8_4_;
    auVar12._12_4_ = auVar7._12_4_ * auVar7._12_4_;
    auVar6 = vmovshdup_avx(auVar12);
    auVar6 = vfmadd231ss_fma(auVar6,auVar7,auVar7);
    uVar3 = uVar5;
  } while (1.0 < auVar6._0_4_);
  rng->state = uVar5;
  return (Point2f)auVar7._0_8_;
}

Assistant:

Point2f RejectionSampleDisk(RNG &rng) {
    Point2f p;
    do {
        p.x = 1 - 2 * rng.Uniform<Float>();
        p.y = 1 - 2 * rng.Uniform<Float>();
    } while (p.x * p.x + p.y * p.y > 1);
    return p;
}